

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_geometry_device.cpp
# Opt level: O3

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats)

{
  Vec3fa *pVVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar8;
  undefined1 auVar6 [12];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar15;
  float fVar16;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar17;
  undefined1 auVar14 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined8 uVar24;
  float fVar25;
  float local_198;
  float fStack_194;
  undefined1 local_138 [8];
  float fStack_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  float local_108;
  undefined8 local_104;
  uint local_f4;
  uint uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined8 local_d8;
  undefined1 local_d0 [16];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [16];
  undefined8 local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined4 local_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined1 auVar7 [16];
  
  fVar11 = (float)x;
  fVar18 = (float)y;
  local_128 = (camera->xfm).l.vz.field_0.field_0.x +
              fVar18 * (camera->xfm).l.vy.field_0.field_0.x +
              fVar11 * (camera->xfm).l.vx.field_0.field_0.x;
  fStack_124 = (camera->xfm).l.vz.field_0.field_0.y +
               fVar18 * (camera->xfm).l.vy.field_0.field_0.y +
               fVar11 * (camera->xfm).l.vx.field_0.field_0.y;
  fVar10 = (camera->xfm).l.vz.field_0.field_0.z +
           fVar18 * (camera->xfm).l.vy.field_0.field_0.z +
           fVar11 * (camera->xfm).l.vx.field_0.field_0.z;
  fVar11 = fVar18 * 0.0 + fVar11 * 0.0 + 0.0;
  fVar18 = fStack_124 * fStack_124;
  fVar16 = fVar10 * fVar10;
  fVar11 = fVar11 * fVar11;
  fVar19 = fVar18 + local_128 * local_128 + fVar16;
  fVar22 = fVar18 + fVar18 + fVar11;
  fVar16 = fVar18 + fVar16 + fVar16;
  fVar11 = fVar18 + fVar11 + fVar11;
  auVar12._4_4_ = fVar22;
  auVar12._0_4_ = fVar19;
  auVar12._8_4_ = fVar16;
  auVar12._12_4_ = fVar11;
  auVar13._4_4_ = fVar22;
  auVar13._0_4_ = fVar19;
  auVar13._8_4_ = fVar16;
  auVar13._12_4_ = fVar11;
  auVar13 = rsqrtss(auVar12,auVar13);
  fVar11 = auVar13._0_4_;
  fStack_120 = fVar11 * fVar11 * fVar19 * -0.5 * fVar11 + fVar11 * 1.5;
  local_128 = fStack_120 * local_128;
  fStack_124 = fStack_120 * fStack_124;
  fStack_120 = fStack_120 * fVar10;
  fStack_130 = (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_138 = *(undefined8 *)&(camera->xfm).p.field_0;
  register0x0000120c = 0;
  fStack_11c = 0.0;
  local_118 = 0xffffffff7f800000;
  local_f4 = 0xffffffff;
  uStack_f0 = 0xffffffff;
  uStack_ec = 0xffffffff;
  uStack_e8 = 0xffffffff;
  local_b8 = 0x70000200000000;
  local_b0 = (undefined1  [16])0x0;
  local_a0 = 0;
  rtcTraversableIntersect1(data->g_traversable,local_138);
  uVar24 = 0;
  fVar10 = 0.0;
  stats->numRays = stats->numRays + 1;
  if (uStack_f0 != 0xffffffff) {
    uVar3 = uStack_f0;
    if (uStack_f0 != 0) {
      uVar3 = local_f4;
    }
    pVVar1 = data->point_colors + uVar3;
    fVar10 = (pVVar1->field_0).m128[0];
    fVar11 = (pVVar1->field_0).m128[1];
    fVar18 = (pVVar1->field_0).m128[2];
    local_d0._0_12_ = ZEXT812(0);
    local_d0._12_4_ = 0;
    auVar6._0_4_ = fVar10 * 0.5 + 0.0;
    auVar6._4_4_ = fVar11 * 0.5 + 0.0;
    auVar6._8_4_ = fVar18 * 0.5 + 0.0;
    auVar7._12_4_ = (pVVar1->field_0).m128[3] * 0.5 + 0.0;
    auVar7._0_12_ = auVar6;
    auVar13 = rsqrtss(auVar7,0x40400000);
    fVar16 = auVar13._0_4_;
    fVar16 = fVar16 * 1.5 - fVar16 * fVar16 * fVar16 * 1.5;
    fVar19 = fVar16 * -1.0;
    fVar22 = fVar16 * -1.0;
    fVar16 = fVar16 * -1.0;
    local_98 = (float)local_118 * local_128 + (float)local_138._0_4_;
    fStack_94 = (float)local_118 * fStack_124 + (float)local_138._4_4_;
    fStack_90 = (float)local_118 * fStack_120 + fStack_130;
    local_88 = -fVar19;
    fStack_84 = -fVar22;
    fStack_80 = -fVar16;
    uStack_8c = 0x3a83126f;
    uStack_7c = 0;
    local_78 = 0xffffffff7f800000;
    local_54 = 0xffffffff;
    uStack_50 = 0xffffffff;
    uStack_4c = 0xffffffff;
    uStack_48 = 0xffffffff;
    local_d8 = 0x70000200000000;
    local_c0 = 0;
    rtcTraversableOccluded1(data->g_traversable,&local_98);
    stats->numRays = stats->numRays + 1;
    if (0.0 <= (float)local_78) {
      local_198 = (float)local_104;
      fStack_194 = (float)((ulong)local_104 >> 0x20);
      fVar4 = local_108 * local_108 + local_198 * local_198 + fStack_194 * fStack_194;
      auVar13 = rsqrtss(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
      fVar5 = auVar13._0_4_;
      fVar20 = fVar5 * 1.5 - fVar5 * fVar5 * fVar4 * 0.5 * fVar5;
      fVar25 = local_108 * fVar20;
      local_198 = fVar20 * local_198;
      fVar20 = fVar20 * fStack_194;
      fVar4 = fStack_120 * fVar20 + fStack_124 * local_198 + local_128 * fVar25;
      fVar4 = fVar4 + fVar4;
      fVar5 = fVar4 * fVar25 - local_128;
      fVar8 = fVar4 * local_198 - fStack_124;
      fVar9 = fVar4 * fVar20 - fStack_120;
      fVar4 = fVar4 * 0.0 - fStack_11c;
      fVar15 = fVar8 * fVar8;
      fVar17 = fVar9 * fVar9;
      fVar4 = fVar4 * fVar4;
      fVar21 = fVar15 + fVar5 * fVar5 + fVar17;
      fVar23 = fVar15 + fVar15 + fVar4;
      fVar17 = fVar15 + fVar17 + fVar17;
      fVar4 = fVar15 + fVar4 + fVar4;
      auVar14._4_4_ = fVar23;
      auVar14._0_4_ = fVar21;
      auVar14._8_4_ = fVar17;
      auVar14._12_4_ = fVar4;
      auVar2._4_4_ = fVar23;
      auVar2._0_4_ = fVar21;
      auVar2._8_4_ = fVar17;
      auVar2._12_4_ = fVar4;
      auVar13 = rsqrtss(auVar14,auVar2);
      fVar4 = auVar13._0_4_;
      fVar4 = fVar4 * 1.5 - fVar4 * fVar4 * fVar21 * 0.5 * fVar4;
      fVar4 = fVar4 * fVar9 * fVar16 + fVar4 * fVar8 * fVar22 + fVar4 * fVar5 * fVar19;
      if (1.0 <= fVar4) {
        fVar4 = 1.0;
      }
      fVar5 = 0.0;
      if (0.0 <= fVar4) {
        fVar5 = fVar4;
      }
      fVar4 = powf(fVar5,10.0);
      fVar16 = -(fVar20 * fVar16 + local_198 * fVar22 + fVar25 * fVar19);
      if (1.0 <= fVar16) {
        fVar16 = 1.0;
      }
      fVar19 = 0.0;
      if (0.0 <= fVar16) {
        fVar19 = fVar16;
      }
      fVar4 = fVar4 * 0.5;
      auVar6._4_4_ = auVar6._4_4_ + fVar11 * fVar19 + fVar4;
      auVar6._0_4_ = auVar6._0_4_ + fVar10 * fVar19 + fVar4;
      auVar6._8_4_ = auVar6._8_4_ + fVar18 * fVar19 + fVar4;
    }
    uVar24 = auVar6._0_8_;
    fVar10 = auVar6._8_4_;
  }
  fVar11 = (float)uVar24;
  if (1.0 <= (float)uVar24) {
    fVar11 = 1.0;
  }
  fVar18 = 0.0;
  if (0.0 <= fVar11) {
    fVar18 = fVar11;
  }
  fVar11 = (float)((ulong)uVar24 >> 0x20);
  if (1.0 <= fVar11) {
    fVar11 = 1.0;
  }
  fVar16 = 0.0;
  if (0.0 <= fVar11) {
    fVar16 = fVar11;
  }
  if (1.0 <= fVar10) {
    fVar10 = 1.0;
  }
  fVar11 = 0.0;
  if (0.0 <= fVar10) {
    fVar11 = fVar10;
  }
  pixels[width * y + x] =
       (int)(long)(fVar16 * 255.0) * 0x100 + (int)(long)(fVar18 * 255.0) +
       (int)(long)(fVar11 * 255.0) * 0x10000;
  return;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                          int x, int y, 
                          int* pixels,
                          const unsigned int width,
                          const unsigned int height,
                          const float time,
                          const ISPCCamera& camera, RayStats& stats)
{
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf);

  /* intersect ray with scene */
  RTCIntersectArguments iargs;
  rtcInitIntersectArguments(&iargs);
  iargs.feature_mask = (RTCFeatureFlags)(FEATURE_MASK);
  
  rtcTraversableIntersect1(data.g_traversable,RTCRayHit_(ray),&iargs);
  RayStats_addRay(stats);

  /* shade pixels */
  Vec3fa color = Vec3fa(0.0f);
  if (ray.geomID != RTC_INVALID_GEOMETRY_ID)
  {
    /* interpolate diffuse color */
    Vec3fa diffuse = data.point_colors[ray.geomID ? ray.primID : 0];

    /* calculate smooth shading normal */
    Vec3fa Ng = normalize(ray.Ng);
    color = color + diffuse*0.5f;
    Vec3fa lightDir = normalize(Vec3fa(-1,-1,-1));

    /* initialize shadow ray */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(lightDir), 0.001f, inf, 0.0f);

    /* trace shadow ray */
    RTCOccludedArguments sargs;
    rtcInitOccludedArguments(&sargs);
    sargs.feature_mask = (RTCFeatureFlags)(FEATURE_MASK);
  
    rtcTraversableOccluded1(data.g_traversable,RTCRay_(shadow),&sargs);
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f) {
      Vec3fa r = normalize(reflect(ray.dir,Ng));
      float s = pow(clamp(dot(r,lightDir),0.0f,1.0f),10.0f);
      float d = clamp(-dot(lightDir,Ng),0.0f,1.0f);
      color = color + diffuse*d + 0.5f*Vec3fa(s);
    }
  }

  /* write color to framebuffer */
  unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}